

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O0

void __thiscall
TApp_IniNotRequiredNotDefault_Test::TApp_IniNotRequiredNotDefault_Test
          (TApp_IniNotRequiredNotDefault_Test *this)

{
  TApp_IniNotRequiredNotDefault_Test *this_local;
  
  TApp::TApp(&this->super_TApp);
  (this->super_TApp).super_Test._vptr_Test =
       (_func_int **)&PTR__TApp_IniNotRequiredNotDefault_Test_001c6960;
  return;
}

Assistant:

TEST_F(TApp, IniNotRequiredNotDefault) {

    TempFile tmpini{"TestIniTmp.ini"};
    TempFile tmpini2{"TestIniTmp2.ini"};

    app.set_config("--config", tmpini);

    {
        std::ofstream out{tmpini};
        out << "[default]" << std::endl;
        out << "two=99" << std::endl;
        out << "three=3" << std::endl;
    }

    {
        std::ofstream out{tmpini2};
        out << "[default]" << std::endl;
        out << "two=98" << std::endl;
        out << "three=4" << std::endl;
    }

    int one = 0, two = 0, three = 0;
    app.add_option("--one", one);
    app.add_option("--two", two);
    app.add_option("--three", three);

    run();

    EXPECT_EQ(99, two);
    EXPECT_EQ(3, three);

    app.reset();
    args = {"--config", tmpini2};
    run();

    EXPECT_EQ(98, two);
    EXPECT_EQ(4, three);
}